

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O0

bool __thiscall higan::HttpRequest::AddHeader(HttpRequest *this,char *begin,char *end)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  mapped_type *this_00;
  allocator<char> local_89;
  key_type local_88;
  allocator<char> local_51;
  string local_50 [32];
  char *local_30;
  char *k_end;
  char *end_local;
  char *begin_local;
  HttpRequest *this_local;
  
  k_end = end;
  end_local = begin;
  begin_local = (char *)this;
  local_30 = std::search<char_const*,char_const*>(begin,end,": ","");
  pcVar2 = k_end;
  bVar1 = 2 < (long)k_end - (long)local_30;
  if (bVar1) {
    pcVar3 = local_30 + 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>(local_50,pcVar3,pcVar2,&local_51);
    pcVar3 = end_local;
    pcVar2 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>((string *)&local_88,pcVar3,pcVar2,&local_89);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->headers_,&local_88);
    std::__cxx11::string::operator=((string *)this_00,local_50);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  return bVar1;
}

Assistant:

bool HttpRequest::AddHeader(const char* begin, const char* end)
{

	const char* k_end = std::search(begin, end, COLON, COLON + 2);

	if (end - k_end < 3)
	{
		return false;
	}

	headers_[{ begin, k_end}] = { k_end + 2, end};
	return true;
}